

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

void __thiscall flow::lang::IRGenerator::codegenInline(IRGenerator *this,HandlerSym *handlerSym)

{
  Report *pRVar1;
  bool bVar2;
  SymbolTable *pSVar3;
  pointer sym;
  Stmt *pSVar4;
  SourceLocation *pSVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_141;
  string local_140;
  reference local_120;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *symbol;
  iterator __end3;
  iterator __begin3;
  SymbolTable *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_c1;
  string local_c0;
  iterator local_a0;
  HandlerSym *local_80;
  iterator local_78;
  iterator local_58;
  undefined1 local_38 [8];
  _Deque_iterator<flow::lang::HandlerSym_*,_flow::lang::HandlerSym_*&,_flow::lang::HandlerSym_**> i;
  HandlerSym *handlerSym_local;
  IRGenerator *this_local;
  
  i._M_node = (_Map_pointer)handlerSym;
  std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::begin
            (&local_58,&this->handlerStack_);
  std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::end
            (&local_78,&this->handlerStack_);
  local_80 = (HandlerSym *)i._M_node;
  std::
  find<std::_Deque_iterator<flow::lang::HandlerSym*,flow::lang::HandlerSym*&,flow::lang::HandlerSym**>,flow::lang::HandlerSym*>
            ((_Deque_iterator<flow::lang::HandlerSym_*,_flow::lang::HandlerSym_*&,_flow::lang::HandlerSym_**>
              *)local_38,&local_58,&local_78,&local_80);
  std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::end
            (&local_a0,&this->handlerStack_);
  bVar2 = std::operator!=((_Self *)local_38,&local_a0);
  if (bVar2) {
    pRVar1 = this->report_;
    pSVar5 = ASTNode::location((ASTNode *)i._M_node);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Cannot recursively call handler {}.",&local_c1);
    psVar6 = Symbol::name_abi_cxx11_((Symbol *)i._M_node);
    std::__cxx11::string::string((string *)&local_f8,(string *)psVar6);
    diagnostics::Report::typeError<std::__cxx11::string>(pRVar1,pSVar5,&local_c0,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  else {
    __range3 = (SymbolTable *)i._M_node;
    std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::push_back
              (&this->handlerStack_,(value_type *)&__range3);
    pSVar3 = HandlerSym::scope((HandlerSym *)i._M_node);
    if (pSVar3 != (SymbolTable *)0x0) {
      pSVar3 = HandlerSym::scope((HandlerSym *)i._M_node);
      __end3 = SymbolTable::begin(pSVar3);
      symbol = (unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *)
               SymbolTable::end(pSVar3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_*,_std::vector<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>_>
                                         *)&symbol), bVar2) {
        local_120 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_*,_std::vector<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>_>
                    ::operator*(&__end3);
        sym = std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>::get
                        (local_120);
        codegen(this,sym);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_*,_std::vector<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    pSVar4 = HandlerSym::body((HandlerSym *)i._M_node);
    if (pSVar4 == (Stmt *)0x0) {
      pRVar1 = this->report_;
      pSVar5 = ASTNode::location((ASTNode *)i._M_node);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Forward declared handler \'{}\' is missing implementation.",
                 &local_141);
      psVar6 = Symbol::name_abi_cxx11_((Symbol *)i._M_node);
      std::__cxx11::string::string((string *)&local_168,(string *)psVar6);
      diagnostics::Report::typeError<std::__cxx11::string>(pRVar1,pSVar5,&local_140,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    pSVar4 = HandlerSym::body((HandlerSym *)i._M_node);
    codegen(this,pSVar4);
    std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::pop_back
              (&this->handlerStack_);
  }
  return;
}

Assistant:

void IRGenerator::codegenInline(HandlerSym& handlerSym) {
  auto i = std::find(handlerStack_.begin(), handlerStack_.end(), &handlerSym);
  if (i != handlerStack_.end()) {
    report_->typeError(handlerSym.location(),
                       "Cannot recursively call handler {}.", handlerSym.name());

    return;
  }

  handlerStack_.push_back(&handlerSym);

  // emit local variable declarations
  if (handlerSym.scope()) {
    for (std::unique_ptr<Symbol>& symbol : *handlerSym.scope()) {
      codegen(symbol.get());
    }
  }

  if (handlerSym.body() == nullptr) {
    report_->typeError(handlerSym.location(),
                       "Forward declared handler '{}' is missing implementation.",
                       handlerSym.name());
  }

  // emit body
  codegen(handlerSym.body());

  handlerStack_.pop_back();
}